

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::cone(Mesh *__return_storage_ptr__,float radius,float _height,int _radiusSegments,
                 int _heightSegments,int _capSegments,DrawMode _drawMode)

{
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint32_t _i;
  int iVar4;
  uint32_t uVar5;
  ulong uVar6;
  int y_1;
  uint uVar7;
  ulong uVar8;
  int y;
  int iVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar18;
  undefined4 uVar21;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar22 [12];
  float fVar23;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar24;
  vec3 vert;
  vec2 tcoord;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_164;
  float local_160;
  float local_15c;
  ulong local_158;
  ulong local_150;
  uint local_148;
  uint local_144;
  ulong local_140;
  vec3 local_138;
  DrawMode local_12c;
  float local_128;
  float local_124;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_120;
  float local_11c;
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  ulong local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  undefined4 uStack_f0;
  ulong local_e8;
  ulong local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  long local_60;
  vec3 local_58;
  undefined1 local_48 [16];
  
  uVar21 = 0;
  local_118 = radius;
  uStack_114 = in_XMM0_Db;
  uStack_110 = in_XMM0_Dc;
  uStack_10c = in_XMM0_Dd;
  Mesh::Mesh(__return_storage_ptr__);
  local_12c = TRIANGLE_STRIP;
  if (0xfffffffd < _drawMode - TRIANGLE_FAN) {
    local_12c = _drawMode;
  }
  __return_storage_ptr__->m_drawMode = local_12c;
  local_150 = (ulong)(_radiusSegments + 1U);
  local_140 = 1;
  if (1 < _heightSegments) {
    local_140 = (ulong)(uint)_heightSegments;
  }
  uVar11 = 0;
  local_124 = (float)(int)(_radiusSegments + 1U) + -1.0;
  local_128 = -6.2831855 / local_124;
  local_f8 = (float)((int)local_140 + 1) + -1.0;
  fVar13 = _height * 0.5;
  local_48 = ZEXT416((uint)fVar13);
  fVar14 = -0.0;
  uVar3 = (ulong)(_capSegments + 1);
  if (_capSegments < 1) {
    uVar3 = uVar11;
  }
  if (0 < _capSegments) {
    fVar14 = (float)(int)uVar3 + -1.0;
  }
  fVar16 = _height / local_f8;
  fVar14 = fVar14 + local_f8;
  local_d8._0_4_ = (undefined4)(int)local_140;
  local_c8._4_4_ = 0x80000000;
  local_c8._0_4_ = -fVar13;
  local_c8._8_4_ = 0x80000000;
  local_c8._12_4_ = 0x80000000;
  local_88 = ZEXT416((uint)ABS(0.0 - (float)local_d8._0_4_));
  local_98._0_4_ = -1.0 - fVar13;
  local_158 = (ulong)(uint)_radiusSegments;
  uStack_f0 = uVar21;
  local_e0 = (ulong)(uint)_capSegments;
  do {
    iVar9 = (int)uVar11;
    if (-1 < (int)local_158) {
      fVar13 = (float)iVar9;
      fVar15 = (fVar13 / (float)local_d8._0_4_) * local_118 + 0.0;
      fVar17 = fVar16 * fVar13 + (float)local_c8._0_4_;
      local_78 = ZEXT416((uint)(1.0 - fVar13 / fVar14));
      local_144 = -(uint)(0.0 <= fVar15 || local_118 < fVar15);
      local_a8._0_4_ = local_118;
      if (fVar15 <= local_118) {
        local_a8._0_4_ = fVar15;
      }
      local_a8._4_4_ = uStack_114;
      local_a8._8_4_ = uStack_110;
      local_a8._12_4_ = uStack_10c;
      local_b8._0_4_ = local_118;
      if (local_118 <= fVar15) {
        local_b8._0_4_ = fVar15;
      }
      local_b8._4_4_ = uStack_114;
      local_b8._8_4_ = uStack_110;
      local_b8._12_4_ = uStack_10c;
      local_148 = -(uint)(fVar15 <= 0.0 || fVar15 < local_118);
      iVar4 = 0;
      do {
        fVar13 = 0.0;
        if (1.1920929e-07 <= (float)local_88._0_4_) {
          if (0.0 <= local_118) {
            fVar13 = (float)local_a8._0_4_;
            uVar7 = local_144;
          }
          else {
            fVar13 = (float)local_b8._0_4_;
            uVar7 = local_148;
          }
          if ((uVar7 & 1) == 0) {
            fVar13 = 0.0;
          }
        }
        fVar15 = local_128 * (float)iVar4;
        local_108 = CONCAT44(local_108._4_4_,fVar15);
        fVar15 = cosf(fVar15);
        local_164.x = fVar15 * fVar13;
        local_160 = fVar17;
        local_15c = sinf((float)local_108);
        local_15c = local_15c * fVar13;
        local_120.x = (float)iVar4 / local_124;
        local_11c = (float)local_78._0_4_;
        Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_120);
        Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
        if (iVar9 == 0) {
          local_164.x = cosf((float)local_108);
          local_160 = fVar17;
          local_15c = sinf((float)local_108);
        }
        fVar13 = local_15c - local_160 * 0.0;
        fVar23 = local_164.x * 0.0 + local_15c * -0.0;
        fVar15 = local_160 * 0.0 - local_164.x;
        aVar24.x = fVar23 * local_15c - fVar15 * (local_160 - (float)local_98._0_4_);
        aVar18.y = fVar15 * local_164.x - local_15c * fVar13;
        local_138.field_2.z = fVar13 * (local_160 - (float)local_98._0_4_) - fVar23 * local_164.x;
        local_138.field_1.y = aVar18.y;
        local_138.field_0.x = aVar24.x;
        fVar13 = local_138.field_2.z * local_138.field_2.z +
                 aVar18.y * aVar18.y + aVar24.x * aVar24.x;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = 1.0 / fVar13;
        local_58.field_2.z = fVar13 * local_138.field_2.z;
        local_58.field_1.y = local_138.field_1.y * fVar13;
        local_58.field_0.x = local_138.field_0.x * fVar13;
        Mesh::addNormal(__return_storage_ptr__,&local_58);
        iVar4 = iVar4 + 1;
      } while ((int)local_150 != iVar4);
    }
    uVar8 = local_150;
    uVar11 = (ulong)(iVar9 + 1);
  } while (iVar9 != (int)local_140);
  local_e8 = uVar3;
  if (local_12c == TRIANGLES) {
    iVar9 = 0;
    uVar2 = 1;
    uVar3 = local_150 & 0xffffffff;
    do {
      local_108 = CONCAT44(local_108._4_4_,(int)uVar3);
      uVar11 = local_158 & 0xffffffff;
      uVar5 = uVar2;
      if (0 < (int)local_158) {
        do {
          _i = (uint32_t)uVar3;
          if (iVar9 != 0) {
            Mesh::addIndex(__return_storage_ptr__,uVar5 - 1);
            Mesh::addIndex(__return_storage_ptr__,uVar5);
            Mesh::addIndex(__return_storage_ptr__,_i);
          }
          Mesh::addIndex(__return_storage_ptr__,uVar5);
          Mesh::addIndex(__return_storage_ptr__,_i + 1);
          Mesh::addIndex(__return_storage_ptr__,_i);
          uVar5 = uVar5 + 1;
          uVar3 = (ulong)(_i + 1);
          uVar7 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      iVar9 = iVar9 + 1;
      uVar3 = (ulong)(uint)((int)(float)local_108 + (int)local_150);
      uVar2 = uVar2 + (int)local_150;
    } while (iVar9 != (int)local_140);
  }
  else {
    uVar2 = 0;
    iVar9 = 0;
    do {
      iVar1 = (int)uVar8;
      iVar4 = iVar1;
      uVar5 = uVar2;
      if (-1 < (int)local_158) {
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar5);
          Mesh::addIndex(__return_storage_ptr__,uVar5 + iVar1);
          uVar5 = uVar5 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      iVar9 = iVar9 + 1;
      uVar2 = uVar2 + iVar1;
    } while (iVar9 != (int)local_140);
  }
  local_60 = (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_138.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_138.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_138.field_2.z = 0.0;
  if (0 < (int)local_e0) {
    local_f8 = local_f8 / fVar14;
    iVar9 = (int)local_e8;
    local_108 = (ulong)(uint)ABS(0.0 - (float)(iVar9 + -1));
    uStack_100 = 0;
    uStack_fc = 0;
    local_c8 = ZEXT416((uint)(0.0 - local_118));
    local_d8 = ZEXT416((uint)(1.0 - local_f8));
    iVar4 = 1;
    if (1 < iVar9) {
      iVar4 = iVar9;
    }
    iVar1 = 0;
    do {
      if (-1 < (int)local_158) {
        fVar14 = (float)iVar1 / (float)(iVar9 + -1);
        fVar13 = fVar14 * (float)local_c8._0_4_ + local_118;
        fVar14 = fVar14 * (float)local_d8._0_4_ + local_f8;
        local_78._0_4_ = -(uint)(local_118 <= fVar13 || 0.0 < fVar13);
        auVar19 = ZEXT812(0);
        if (fVar13 <= 0.0) {
          auVar19._4_8_ = 0;
          auVar19._0_4_ = fVar13;
        }
        local_88._12_4_ = 0;
        local_88._0_12_ = auVar19;
        auVar22 = ZEXT812(0);
        if (0.0 <= fVar13) {
          auVar22._4_8_ = 0;
          auVar22._0_4_ = fVar13;
        }
        local_98._12_4_ = 0;
        local_98._0_12_ = auVar22;
        local_144 = -(uint)(fVar13 <= local_118 || fVar13 < 0.0);
        auVar20 = ZEXT812(0x3f800000);
        if (fVar14 <= 1.0) {
          auVar20._4_8_ = 0;
          auVar20._0_4_ = fVar14;
        }
        local_a8._12_4_ = 0;
        local_a8._0_12_ = auVar20;
        fVar13 = 1.0;
        if (1.0 <= fVar14) {
          fVar13 = fVar14;
        }
        local_b8 = ZEXT416((uint)fVar13);
        local_148 = -(uint)(1.0 < fVar14 || local_f8 <= fVar14);
        local_140 = CONCAT44(local_140._4_4_,-(uint)(fVar14 < 1.0 || fVar14 <= local_f8));
        iVar10 = 0;
        do {
          fVar14 = local_118;
          if (1.1920929e-07 <= (float)local_108) {
            if (local_118 <= 0.0) {
              fVar14 = (float)local_88._0_4_;
              if ((local_78 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0021f82d;
            }
            else {
              fVar14 = (float)local_98._0_4_;
              if ((local_144 & 1) == 0) {
LAB_0021f82d:
                fVar14 = local_118;
              }
            }
          }
          fVar13 = local_128 * (float)iVar10;
          fVar16 = cosf(fVar13);
          local_164.x = fVar16 * fVar14;
          local_15c = sinf(fVar13);
          local_15c = local_15c * fVar14;
          local_160 = (float)local_48._0_4_;
          local_120.x = (float)iVar10 / local_124;
          local_11c = local_f8;
          if (1.1920929e-07 <= (float)local_108) {
            if (local_f8 <= 1.0) {
              local_11c = (float)local_a8._0_4_;
              if ((local_148 & 1) == 0) goto LAB_0021f8e7;
            }
            else {
              local_11c = (float)local_b8._0_4_;
              if ((local_140 & 1) == 0) {
LAB_0021f8e7:
                local_11c = local_f8;
              }
            }
          }
          local_11c = 1.0 - local_11c;
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_120);
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_164);
          Mesh::addNormal(__return_storage_ptr__,&local_138);
          iVar10 = iVar10 + 1;
        } while ((int)local_150 != iVar10);
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 != iVar4);
  }
  uVar3 = local_150;
  uVar11 = (local_60 >> 2) * -0x5555555555555555;
  iVar9 = (int)local_e8;
  if (local_12c == TRIANGLES) {
    if (0 < (int)local_e0) {
      iVar4 = 2;
      if (2 < iVar9) {
        iVar4 = iVar9;
      }
      local_118 = (float)(iVar4 + -2);
      uVar2 = (int)local_158 + (int)uVar11 + 2;
      iVar4 = 0;
      do {
        uVar3 = uVar11 & 0xffffffff;
        uVar8 = local_158 & 0xffffffff;
        uVar5 = uVar2;
        local_108 = uVar11;
        if (0 < (int)local_158) {
          do {
            Mesh::addIndex(__return_storage_ptr__,(uint32_t)uVar3);
            uVar7 = (uint32_t)uVar3 + 1;
            uVar3 = (ulong)uVar7;
            Mesh::addIndex(__return_storage_ptr__,uVar7);
            Mesh::addIndex(__return_storage_ptr__,uVar5 - 1);
            if (iVar4 < iVar9 + -2) {
              Mesh::addIndex(__return_storage_ptr__,uVar7);
              Mesh::addIndex(__return_storage_ptr__,uVar5);
              Mesh::addIndex(__return_storage_ptr__,uVar5 - 1);
            }
            uVar5 = uVar5 + 1;
            uVar7 = (int)uVar8 - 1;
            uVar8 = (ulong)uVar7;
          } while (uVar7 != 0);
        }
        uVar2 = uVar2 + (int)local_150;
        uVar11 = (ulong)(uint)((int)local_108 + (int)local_150);
        bVar12 = (float)iVar4 != local_118;
        iVar4 = iVar4 + 1;
      } while (bVar12);
    }
  }
  else if (0 < (int)local_e0) {
    iVar4 = 2;
    if (2 < iVar9) {
      iVar4 = iVar9;
    }
    iVar9 = 0;
    do {
      iVar1 = (int)uVar3;
      uVar6 = uVar3 & 0xffffffff;
      uVar8 = uVar11;
      if (-1 < (int)local_158) {
        do {
          uVar2 = (uint32_t)uVar8;
          Mesh::addIndex(__return_storage_ptr__,uVar2);
          Mesh::addIndex(__return_storage_ptr__,uVar2 + iVar1);
          uVar8 = (ulong)(uVar2 + 1);
          uVar7 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      uVar11 = (ulong)(uint)((int)uVar11 + iVar1);
      bVar12 = iVar9 != iVar4 + -2;
      iVar9 = iVar9 + 1;
    } while (bVar12);
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh cone( float radius, float _height, int _radiusSegments, int _heightSegments, int _capSegments, DrawMode _drawMode ) {
    Mesh mesh;
    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLE_STRIP;

    mesh.setDrawMode(_drawMode);

    _radiusSegments = _radiusSegments+1;
    _capSegments = _capSegments+1;
    _heightSegments = _heightSegments+1;
    if (_heightSegments < 2) _heightSegments = 2;
    int capSegs = _capSegments;
    if ( capSegs < 2 )
        capSegs = 0;

    float angleIncRadius = -1.f * ((TAU/((float)_radiusSegments-1.f)));
    float heightInc = _height/((float)_heightSegments-1);
    float halfH = _height*.5f;

    float newRad;
    glm::vec3 vert;
    glm::vec3 normal;
    glm::vec2 tcoord;
    glm::vec3 up(0.0,1.0,0.0);

    std::size_t vertOffset = 0;

    float maxTexY = _heightSegments-1.f;
    if (capSegs > 0) 
        maxTexY += capSegs-1.f;

    glm::vec3 startVec(0, -halfH-1.f, 0);

    // cone vertices //
    for (int iy = 0; iy < _heightSegments; iy++) {
        for (int ix = 0; ix < _radiusSegments; ix++) {

            newRad = remap((float)iy, 0, _heightSegments-1, 0.0, radius, true);
            vert.x = cos((float)ix*angleIncRadius) * newRad;
            vert.y = heightInc*((float)iy) - halfH;
            vert.z = sin((float)ix*angleIncRadius) * newRad;

            tcoord.x = (float)ix/((float)_radiusSegments-1.f);
            tcoord.y = 1.f - (float)iy/((float)maxTexY);

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );

            if (iy == 0) {
                newRad = 1.f;
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.y = heightInc*((float)iy) - halfH;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
            }

            glm::vec3 diff = vert - startVec;
            glm::vec3 crossed = glm::cross(up, vert);
            normal = glm::cross(crossed, diff);
            mesh.addNormal( glm::normalize(normal) );

        }
    }

    if (_drawMode == TRIANGLES) {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments-1; x++) {
                if (y > 0){
                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x );
                    mesh.addIndex( (y)*_radiusSegments + x+1 );
                    mesh.addIndex( (y+1)*_radiusSegments + x );
                }

                // second triangle //
                mesh.addIndex( (y)*_radiusSegments + x+1 );
                mesh.addIndex( (y+1)*_radiusSegments + x+1 );
                mesh.addIndex( (y+1)*_radiusSegments + x );
            }
        }
    }
    else {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments; x++) {
                mesh.addIndex( (y)*_radiusSegments + x );
                mesh.addIndex( (y+1)*_radiusSegments + x );
            }
        }
    }

    vertOffset = mesh.getVerticesTotal();
    float maxTexYNormalized = (_heightSegments-1.f) / maxTexY;

    // add the cap //
    normal = glm::vec3(0.f, 1.f, 0.f);
    for (int iy = 0; iy < capSegs; iy++) {
        for (int ix = 0; ix < _radiusSegments; ix++) {
            newRad = remap((float)iy, 0, capSegs-1, radius, 0.0, true);
            vert.x = cos((float)ix*angleIncRadius) * newRad;
            vert.z = sin((float)ix*angleIncRadius) * newRad;
            vert.y = halfH;

            tcoord.x = (float)ix/((float)_radiusSegments-1.f);
            tcoord.y = 1.f - remap(iy, 0, capSegs-1, maxTexYNormalized, 1.f, true);

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );
            mesh.addNormal( normal );
        }
    }

    if (_drawMode == TRIANGLES) {
        if ( capSegs > 0 ) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {

                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);

                    if (y < capSegs-2) {
                        // second triangle //
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }
                }
            }
        }
    }
    else {
        if (capSegs > 0 ) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }
    }

    return mesh;
}